

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O1

Var JSON::Stringify(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  int iVar8;
  undefined4 *puVar9;
  RecyclableObject *aValue;
  RecyclableObject *pRVar10;
  undefined4 extraout_var;
  LazyJSONString *pLVar11;
  int in_stack_00000010;
  Type local_a0;
  Type TStack_98;
  undefined1 local_90 [8];
  AutoTagNativeLibraryEntry __tag;
  Var result;
  CallInfo local_58;
  CallInfo callInfo_local;
  RecyclableObject *local_48;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != local_58._0_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                       ,0x69,"(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                       "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b6f6f6;
    *puVar9 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_40 = (undefined1  [8])local_58;
  Js::ArgumentReader::AdjustArguments((ArgumentReader *)auStack_40,&local_58);
  pJVar3 = (((function->type).ptr)->javascriptLibrary).ptr;
  pSVar2 = (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_90,function,local_58,L"JSON.stringify",
             &stack0x00000000);
  if (((ulong)local_58 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                       ,0x6e,"(!(callInfo.Flags & Js::CallFlags_New))",
                       "!(callInfo.Flags & Js::CallFlags_New)");
    if (!bVar5) goto LAB_00b6f6f6;
    *puVar9 = 0;
  }
  if (((ulong)auStack_40 & 0xfffffe) != 0) {
    aValue = (RecyclableObject *)Js::Arguments::operator[]((Arguments *)auStack_40,1);
    if ((auStack_40._0_4_ & 0xffffff) < 3) {
      callInfo_local = (CallInfo)0x0;
    }
    else {
      callInfo_local = (CallInfo)Js::Arguments::operator[]((Arguments *)auStack_40,2);
    }
    if (((ulong)auStack_40 & 0xfffffc) == 0) {
      local_48 = (pJVar3->super_JavascriptLibraryBase).nullValue.ptr;
    }
    else {
      local_48 = (RecyclableObject *)Js::Arguments::operator[]((Arguments *)auStack_40,3);
    }
    if (aValue == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00b6f6f6;
      *puVar9 = 0;
    }
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00b6f6f6;
      *puVar9 = 0;
    }
    pLVar11 = (LazyJSONString *)0x3;
    if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
       (pLVar11 = (LazyJSONString *)&DAT_00000004, (ulong)aValue >> 0x32 == 0)) {
      pRVar10 = Js::UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (pRVar10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00b6f6f6;
        *puVar9 = 0;
      }
      TVar1 = ((pRVar10->type).ptr)->typeId;
      pLVar11 = (LazyJSONString *)(ulong)TVar1;
      if ((0x57 < (int)TVar1) && (BVar7 = Js::RecyclableObject::IsExternal(pRVar10), BVar7 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar5) goto LAB_00b6f6f6;
        *puVar9 = 0;
      }
    }
    if ((int)pLVar11 == 0x17) {
      pRVar10 = Js::VarTo<Js::RecyclableObject>(aValue);
      iVar8 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x56])(pRVar10);
      pRVar10 = (RecyclableObject *)CONCAT44(extraout_var,iVar8);
      if (pRVar10 == (RecyclableObject *)0x0) {
        pRVar10 = Js::VarTo<Js::RecyclableObject>(aValue);
        local_a0._0_4_ = auStack_40._0_4_;
        local_a0._4_4_ = auStack_40._4_4_;
        TStack_98._0_4_ = args.super_Arguments.Info._0_4_;
        TStack_98._4_4_ = args.super_Arguments.Info._4_4_;
        iVar8 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar10,Stringify,&local_a0,&__tag.entry.next)
        ;
        bVar5 = iVar8 == 0;
        pLVar11 = (LazyJSONString *)__tag.entry.next;
      }
      else {
        bVar6 = Js::VarIsImpl<Js::DynamicObject>(pRVar10);
        bVar5 = true;
        aValue = pRVar10;
        if (!bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pLVar11 = (LazyJSONString *)__tls_get_addr(&PTR_0155fe48);
          *(undefined4 *)
           &(pLVar11->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSON.cpp"
                             ,0x80,"(Js::VarIsCorrectType(remoteObject))",
                             "Js::VarIsCorrectType(remoteObject)");
          if (!bVar6) {
LAB_00b6f6f6:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *(undefined4 *)
           &(pLVar11->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
        }
      }
      if (!bVar5) goto LAB_00b6f6d8;
    }
    pLVar11 = Js::JSONStringifier::Stringify(pSVar2,aValue,(Var)callInfo_local,local_48);
    if (pLVar11 != (LazyJSONString *)0x0) goto LAB_00b6f6d8;
  }
  pLVar11 = (LazyJSONString *)(pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
LAB_00b6f6d8:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_90);
  return pLVar11;
}

Assistant:

Js::Var Stringify(Js::RecyclableObject* function, Js::CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        //ES5: Stringify(value, [replacer][, space]])
        ARGUMENTS(args, callInfo);
        Js::JavascriptLibrary* library = function->GetType()->GetLibrary();
        Js::ScriptContext* scriptContext = library->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("JSON.stringify"));

        Assert(!(callInfo.Flags & Js::CallFlags_New));

        if (args.Info.Count < 2)
        {
            // if value is missing it is assumed to be 'undefined'.
            // shortcut: the stringify algorithm returns undefined in this case.
            return library->GetUndefined();
        }
        Js::Var value = args[1];
        Js::Var replacerArg = args.Info.Count > 2 ? args[2] : nullptr;
        Js::Var space = args.Info.Count > 3 ? args[3] : library->GetNull();

        if (Js::JavascriptOperators::GetTypeId(value) == Js::TypeIds_HostDispatch)
        {
            // If we a remote object, we need to pull out the underlying JS object to stringify that
            Js::DynamicObject* remoteObject = Js::VarTo<Js::RecyclableObject>(value)->GetRemoteObject();
            if (remoteObject != nullptr)
            {
                AssertOrFailFast(Js::VarIsCorrectType(remoteObject));
                value = remoteObject;
            }
            else
            {
                Js::Var result;
                if (Js::VarTo<Js::RecyclableObject>(value)->InvokeBuiltInOperationRemotely(Stringify, args, &result))
                {
                    return result;
                }
            }
        }

        LazyJSONString* lazy = JSONStringifier::Stringify(scriptContext, value, replacerArg, space);
        if (!lazy)
        {
            return library->GetUndefined();
        }
        return lazy;
    }